

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_cat(char *s1,ssize_t i1,ssize_t j1,char *s2,ssize_t i2,ssize_t j2)

{
  size_t sVar1;
  ssize_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RCX;
  char *in_RDI;
  ssize_t t_1;
  size_t len_1;
  ssize_t t;
  size_t len;
  char *p;
  char *new;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *local_40;
  size_t local_30;
  size_t local_28;
  long local_18;
  ssize_t local_10;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 == 0) {
    local_10 = 0;
    local_18 = 0;
  }
  else {
    local_10 = IDX(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    sVar2 = IDX(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_18 = sVar2;
    if (sVar2 < local_10) {
      local_18 = local_10;
      local_10 = sVar2;
    }
  }
  sVar1 = strlen(in_RCX);
  if (sVar1 == 0) {
    local_28 = 0;
    local_30 = 0;
  }
  else {
    local_28 = IDX(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    sVar3 = IDX(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_30 = sVar3;
    if ((long)sVar3 < (long)local_28) {
      in_stack_ffffffffffffffa0 = local_28;
      local_30 = local_28;
      local_28 = sVar3;
    }
  }
  IDXLEN(local_10,local_18);
  IDXLEN(local_28,local_30);
  pcVar4 = (char *)zt_malloc_p(in_stack_ffffffffffffffa0);
  local_40 = pcVar4;
  while (local_10 <= local_18) {
    *local_40 = in_RDI[local_10];
    local_40 = local_40 + 1;
    local_10 = local_10 + 1;
  }
  while ((long)local_28 <= (long)local_30) {
    *local_40 = in_RCX[local_28];
    local_40 = local_40 + 1;
    local_28 = local_28 + 1;
  }
  *local_40 = '\0';
  return pcVar4;
}

Assistant:

char *
zt_cstr_cat(const char *s1, ssize_t i1, ssize_t j1,
            const char *s2, ssize_t i2, ssize_t j2) {
    char * new;
    char * p;

    CONVERT(s1, i1, j1);
    CONVERT(s2, i2, j2);

    p = new = zt_malloc(char, IDXLEN(i1, j1) + IDXLEN(i2, j2) + 1);

    while (i1 <= j1) {
        *p++ = s1[i1++];
    }

    while (i2 <= j2) {
        *p++ = s2[i2++];
    }

    *p = '\0';
    return new;
}